

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O1

void rc04_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar2 = get_ext_param(p,ext_params,0);
  dVar3 = get_ext_param(p,ext_params,1);
  dVar4 = get_ext_param(p,ext_params,2);
  dVar5 = get_ext_param(p,ext_params,3);
  pdVar1 = p->mix_coef;
  *pdVar1 = (1.0 - dVar2) - dVar3;
  pdVar1[1] = dVar3;
  pdVar1[2] = 1.0 - dVar5 * dVar4;
  pdVar1[3] = dVar4;
  p->cam_alpha = dVar2;
  return;
}

Assistant:

static void
rc04_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double a0, ax, ac, d;

  assert(p != NULL);

  a0 = get_ext_param(p, ext_params, 0);
  ax = get_ext_param(p, ext_params, 1);
  ac = get_ext_param(p, ext_params, 2);
  d  = get_ext_param(p, ext_params, 3);

  p->mix_coef[0] = 1.0 - a0 - ax;
  p->mix_coef[1] = ax;
  p->mix_coef[2] = 1.0 - d*ac;
  p->mix_coef[3] = ac;

  p->cam_alpha = a0;
}